

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3Vacuum(Parse *pParse,Token *pNm)

{
  uint p1;
  uint uVar1;
  Vdbe *p;
  Token *local_28;
  
  p = pParse->pVdbe;
  local_28 = pNm;
  if (p == (Vdbe *)0x0) {
    p = allocVdbe(pParse);
  }
  if (p != (Vdbe *)0x0) {
    if (pNm == (Token *)0x0) {
      p1 = 0;
    }
    else {
      p1 = sqlite3TwoPartName(pParse,pNm,pNm,&local_28);
      if ((int)p1 < 0) {
        return;
      }
    }
    if (p1 != 1) {
      sqlite3VdbeAddOp3(p,10,p1,0,0);
      uVar1 = 1 << ((byte)p1 & 0x1f);
      p->btreeMask = p->btreeMask | uVar1;
      if ((p->db->aDb[p1].pBt)->sharable != '\0') {
        p->lockMask = p->lockMask | uVar1;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Vacuum(Parse *pParse, Token *pNm){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int iDb = 0;
  if( v==0 ) return;
  if( pNm ){
#ifndef SQLITE_BUG_COMPATIBLE_20160819
    /* Default behavior:  Report an error if the argument to VACUUM is
    ** not recognized */
    iDb = sqlite3TwoPartName(pParse, pNm, pNm, &pNm);
    if( iDb<0 ) return;
#else
    /* When SQLITE_BUG_COMPATIBLE_20160819 is defined, unrecognized arguments
    ** to VACUUM are silently ignored.  This is a back-out of a bug fix that
    ** occurred on 2016-08-19 (https://www.sqlite.org/src/info/083f9e6270).
    ** The buggy behavior is required for binary compatibility with some
    ** legacy applications. */
    iDb = sqlite3FindDb(pParse->db, pNm);
    if( iDb<0 ) iDb = 0;
#endif
  }
  if( iDb!=1 ){
    sqlite3VdbeAddOp1(v, OP_Vacuum, iDb);
    sqlite3VdbeUsesBtree(v, iDb);
  }
  return;
}